

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

int __thiscall
slang::parsing::Trivia::clone
          (Trivia *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TriviaKind TVar1;
  SyntaxNode *pSVar2;
  BumpAllocator *alloc_local;
  Trivia *this_local;
  Trivia result;
  
  Trivia((Trivia *)&this_local);
  result.field_0._5_1_ = this->kind;
  result.field_0._4_1_ = this->hasFullLocation & 1;
  TVar1 = this->kind;
  if (TVar1 == SkippedTokens) {
    this_local._0_4_ = (int)*(undefined8 *)&this->field_0;
  }
  else if (TVar1 == SkippedSyntax || TVar1 == Directive) {
    this_local._0_4_ = (int)*(undefined8 *)&this->field_0;
  }
  else {
    if ((this->hasFullLocation & 1U) == 0) {
      this_local = (Trivia *)(this->field_0).tokens.ptr;
    }
    else {
      this_local = (Trivia *)
                   BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>
                             ((BumpAllocator *)__fn);
      pSVar2 = (this->field_0).syntaxNode;
      (((FullLocation *)this_local)->text)._M_len = (size_t)pSVar2->parent;
      (((FullLocation *)this_local)->text)._M_str = *(char **)&pSVar2->kind;
      ((FullLocation *)this_local)->location = ((this->field_0).fullLocation)->location;
    }
  }
  return (int)this_local;
}

Assistant:

Trivia Trivia::clone(BumpAllocator& alloc) const {
    Trivia result;
    result.kind = kind;
    result.hasFullLocation = hasFullLocation;

    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            result.syntaxNode = syntaxNode;
            break;
        case TriviaKind::SkippedTokens:
            result.tokens = tokens;
            break;
        default:
            if (hasFullLocation) {
                result.fullLocation = alloc.emplace<FullLocation>();
                result.fullLocation->text = fullLocation->text;
                result.fullLocation->location = fullLocation->location;
            }
            else {
                result.rawText = rawText;
            }
            break;
    }

    return result;
}